

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O1

CURLcode Curl_rtsp_parseheader(Curl_easy *data,char *header)

{
  uchar *puVar1;
  FILEPROTO *pFVar2;
  char *pcVar3;
  curl_trc_feat *pcVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  CURLcode CVar9;
  size_t sVar10;
  char *pcVar11;
  int iVar12;
  char *pcVar13;
  size_t length;
  curl_off_t CSeq;
  char *p;
  curl_off_t chan2;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  iVar7 = curl_strnequal(header,"CSeq:",5);
  if (iVar7 != 0) {
    local_50 = (char *)0x0;
    pFVar2 = (data->req).p.file;
    local_48 = header + 5;
    Curl_str_passblanks(&local_48);
    iVar7 = Curl_str_number(&local_48,(curl_off_t *)&local_50,0x7fffffffffffffff);
    if (iVar7 == 0) {
      pFVar2->freepath = local_50;
      (data->state).rtsp_CSeq_recv = (long)local_50;
      return CURLE_OK;
    }
    Curl_failf(data,"Unable to read the CSeq header: [%s]",header);
    return CURLE_RTSP_CSEQ_ERROR;
  }
  iVar7 = curl_strnequal(header,"Session:",8);
  if (iVar7 == 0) {
    iVar7 = curl_strnequal(header,"Transport:",10);
    if (iVar7 == 0) {
      return CURLE_OK;
    }
    pcVar13 = header + 10;
    local_50 = pcVar13;
    while( true ) {
      if (*local_50 == '\0') {
        return CURLE_OK;
      }
      Curl_str_passblanks(&local_50);
      pcVar3 = local_50;
      pcVar11 = strchr(local_50,0x3b);
      iVar7 = curl_strnequal(pcVar3,"interleaved=",0xc);
      if (iVar7 != 0) break;
      local_50 = pcVar11 + 1;
      if (pcVar11 == (char *)0x0) {
        return CURLE_OK;
      }
    }
    local_38 = local_50 + 0xc;
    iVar7 = Curl_str_number(&local_38,(curl_off_t *)&local_48,0xff);
    if (iVar7 != 0) {
      if (data == (Curl_easy *)0x0) {
        return CURLE_OK;
      }
      if (((data->set).field_0x89f & 0x40) == 0) {
        return CURLE_OK;
      }
      pcVar4 = (data->state).feat;
      if ((pcVar4 != (curl_trc_feat *)0x0) && (pcVar4->log_level < 1)) {
        return CURLE_OK;
      }
      Curl_infof(data,"Unable to read the interleaved parameter from Transport header: [%s]",pcVar13
                );
      return CURLE_OK;
    }
    local_40 = local_48;
    iVar7 = Curl_str_single(&local_38,'-');
    if ((iVar7 == 0) &&
       (iVar7 = Curl_str_number(&local_38,(curl_off_t *)&local_40,0xff), iVar7 != 0)) {
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
      {
        Curl_infof(data,"Unable to read the interleaved parameter from Transport header: [%s]",
                   pcVar13);
      }
      local_40 = local_48;
    }
    if ((long)local_40 < (long)local_48) {
      return CURLE_OK;
    }
    do {
      iVar7 = (int)local_48;
      iVar12 = iVar7 + 7;
      if (-1 < iVar7) {
        iVar12 = iVar7;
      }
      puVar1 = (data->state).rtp_channel_mask + (iVar12 >> 3);
      *puVar1 = *puVar1 | (byte)(1 << ((byte)local_48 & 7));
      local_48 = local_48 + 1;
    } while (local_40 + 1 != local_48);
    return CURLE_OK;
  }
  local_50 = header + 8;
  Curl_str_passblanks(&local_50);
  pcVar13 = local_50;
  if (*local_50 == '\0') {
    Curl_failf(data,"Got a blank Session ID");
  }
  else {
    length = 0xffffffffffffffff;
    do {
      lVar6 = length + 1;
      length = length + 1;
      if (local_50[lVar6] < '!') break;
    } while (local_50[lVar6] != ';');
    pcVar3 = (data->set).str[0x33];
    if (pcVar3 == (char *)0x0) {
      pcVar11 = (char *)Curl_memdup0(local_50,length);
      (data->set).str[0x33] = pcVar11;
      if (pcVar11 == (char *)0x0) {
        CVar9 = CURLE_OUT_OF_MEMORY;
        bVar5 = false;
        goto LAB_001522cd;
      }
LAB_00152267:
      CVar9 = (CURLcode)pcVar11;
      bVar5 = true;
      goto LAB_001522cd;
    }
    sVar10 = strlen(pcVar3);
    if (sVar10 == length) {
      uVar8 = strncmp(pcVar13,pcVar3,length);
      pcVar11 = (char *)(ulong)uVar8;
      if (uVar8 == 0) goto LAB_00152267;
    }
    Curl_failf(data,"Got RTSP Session ID Line [%s], but wanted ID [%s]",pcVar13,pcVar3);
  }
  bVar5 = false;
  CVar9 = CURLE_RTSP_SESSION_ERROR;
LAB_001522cd:
  if (bVar5) {
    return CURLE_OK;
  }
  return CVar9;
}

Assistant:

CURLcode Curl_rtsp_parseheader(struct Curl_easy *data, const char *header)
{
  if(checkprefix("CSeq:", header)) {
    curl_off_t CSeq = 0;
    struct RTSP *rtsp = data->req.p.rtsp;
    const char *p = &header[5];
    Curl_str_passblanks(&p);
    if(Curl_str_number(&p, &CSeq, LONG_MAX)) {
      failf(data, "Unable to read the CSeq header: [%s]", header);
      return CURLE_RTSP_CSEQ_ERROR;
    }
    rtsp->CSeq_recv = (long)CSeq; /* mark the request */
    data->state.rtsp_CSeq_recv = (long)CSeq; /* update the handle */
  }
  else if(checkprefix("Session:", header)) {
    const char *start, *end;
    size_t idlen;

    /* Find the first non-space letter */
    start = header + 8;
    Curl_str_passblanks(&start);

    if(!*start) {
      failf(data, "Got a blank Session ID");
      return CURLE_RTSP_SESSION_ERROR;
    }

    /* Find the end of Session ID
     *
     * Allow any non whitespace content, up to the field separator or end of
     * line. RFC 2326 is not 100% clear on the session ID and for example
     * gstreamer does url-encoded session ID's not covered by the standard.
     */
    end = start;
    while((*end > ' ') && (*end != ';'))
      end++;
    idlen = end - start;

    if(data->set.str[STRING_RTSP_SESSION_ID]) {

      /* If the Session ID is set, then compare */
      if(strlen(data->set.str[STRING_RTSP_SESSION_ID]) != idlen ||
         strncmp(start, data->set.str[STRING_RTSP_SESSION_ID], idlen)) {
        failf(data, "Got RTSP Session ID Line [%s], but wanted ID [%s]",
              start, data->set.str[STRING_RTSP_SESSION_ID]);
        return CURLE_RTSP_SESSION_ERROR;
      }
    }
    else {
      /* If the Session ID is not set, and we find it in a response, then set
       * it.
       */

      /* Copy the id substring into a new buffer */
      data->set.str[STRING_RTSP_SESSION_ID] = Curl_memdup0(start, idlen);
      if(!data->set.str[STRING_RTSP_SESSION_ID])
        return CURLE_OUT_OF_MEMORY;
    }
  }
  else if(checkprefix("Transport:", header)) {
    CURLcode result;
    result = rtsp_parse_transport(data, header + 10);
    if(result)
      return result;
  }
  return CURLE_OK;
}